

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpBase::BeginSection
          (BinaryReaderObjdumpBase *this,Index section_index,BinarySection section_code,Offset size)

{
  iterator __position;
  BinarySection local_4;
  
  this->section_starts_[section_code] =
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  __position._M_current =
       (this->section_types_).
       super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->section_types_).
      super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::BinarySection,std::allocator<wabt::BinarySection>>::
    _M_realloc_insert<wabt::BinarySection_const&>
              ((vector<wabt::BinarySection,std::allocator<wabt::BinarySection>> *)
               &this->section_types_,__position,&local_4);
  }
  else {
    *__position._M_current = section_code;
    (this->section_types_).
    super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpBase::BeginSection(Index section_index,
                                             BinarySection section_code,
                                             Offset size) {
  section_starts_[static_cast<size_t>(section_code)] = state->offset;
  section_types_.push_back(section_code);
  return Result::Ok;
}